

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

IRNode * __thiscall kratos::IfStmt::get_child(IfStmt *this,uint64_t index)

{
  uint64_t index_local;
  IfStmt *this_local;
  
  if (index == 0) {
    this_local = (IfStmt *)
                 std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                           (&(this->predicate_).
                             super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  }
  else if (index == 1) {
    this_local = (IfStmt *)
                 std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                           (&(this->then_body_).
                             super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                           );
  }
  else if (index == 2) {
    this_local = (IfStmt *)
                 std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                           (&(this->else_body_).
                             super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                           );
  }
  else {
    this_local = (IfStmt *)0x0;
  }
  return (IRNode *)this_local;
}

Assistant:

IRNode *IfStmt::get_child(uint64_t index) {
    if (index == 0)
        return predicate_.get();
    else if (index == 1)
        return then_body_.get();
    else if (index == 2)
        return else_body_.get();
    else
        return nullptr;
}